

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

bool __thiscall Lib::Stack<Shell::Options::Mode>::find(Stack<Shell::Options::Mode> *this,Mode *el)

{
  bool bVar1;
  Mode MVar2;
  Iterator *in_RSI;
  Iterator it;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  RefIterator local_10;
  
  Iterator::Iterator(in_RSI,(Stack<Shell::Options::Mode> *)
                            CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  do {
    bVar1 = RefIterator::hasNext(&local_10);
    if (!bVar1) {
      return false;
    }
    MVar2 = Iterator::next((Iterator *)0x795497);
  } while (MVar2 != *(Mode *)&(in_RSI->super_RefIterator)._pointer);
  return true;
}

Assistant:

bool find(const C& el) const
  {
    Iterator it(const_cast<Stack&>(*this));
    while(it.hasNext()) {
      if(it.next()==el) {
	return true;
      }
    }
    return false;
  }